

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O2

void xchacha_init(chacha_state *S,chacha_key *key,chacha_iv24 *iv,size_t rounds)

{
  chacha_state_internal *state;
  chacha_key subkey;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  hchacha_ref(key->b,iv->b,(uint8_t *)&local_40,rounds);
  *(undefined8 *)(S->opaque + 0x10) = local_30;
  *(undefined8 *)(S->opaque + 0x18) = uStack_28;
  *(undefined8 *)S->opaque = local_40;
  *(undefined8 *)(S->opaque + 8) = uStack_38;
  S->opaque[0x20] = '\0';
  S->opaque[0x21] = '\0';
  S->opaque[0x22] = '\0';
  S->opaque[0x23] = '\0';
  S->opaque[0x24] = '\0';
  S->opaque[0x25] = '\0';
  S->opaque[0x26] = '\0';
  S->opaque[0x27] = '\0';
  *(undefined8 *)(S->opaque + 0x28) = *(undefined8 *)(iv->b + 0x10);
  *(size_t *)(S->opaque + 0x30) = rounds;
  S->opaque[0x38] = '\0';
  S->opaque[0x39] = '\0';
  S->opaque[0x3a] = '\0';
  S->opaque[0x3b] = '\0';
  S->opaque[0x3c] = '\0';
  S->opaque[0x3d] = '\0';
  S->opaque[0x3e] = '\0';
  S->opaque[0x3f] = '\0';
  return;
}

Assistant:

void
chacha_init(chacha_state *S, const chacha_key *key, const chacha_iv *iv, size_t rounds) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    memcpy(state->s + 0, key, 32);
    memset(state->s + 32, 0, 8);
    memcpy(state->s + 40, iv, 8);
    state->rounds = rounds;
    state->leftover = 0;
}